

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReaderMgr.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::ReaderMgr::skipPastSpaces(ReaderMgr *this,bool *skippedSomething,bool inDecl)

{
  bool bVar1;
  
  *skippedSomething = false;
  do {
    bVar1 = XMLReader::skipSpaces(this->fCurReader,skippedSomething,inDecl);
    if (bVar1) {
      return;
    }
    bVar1 = popReader(this);
  } while (bVar1);
  return;
}

Assistant:

void ReaderMgr::skipPastSpaces(bool& skippedSomething, bool inDecl /* = false */)
{
    // we rely on the fact that fCurReader->skipSpaces will NOT reset the flag to false, but only
    // set it to true if a space is found
    skippedSomething = false;
    //
    //  Skip all the spaces in the current reader. If it returned because
    //  it hit a non-space, break out. Else we have to pop another entity
    //  and keep going.
    //
    while (!fCurReader->skipSpaces(skippedSomething, inDecl))
    {
        // Try to pop another entity. If we can't then we are done
        if (!popReader())
            break;
    }
}